

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation_p.h
# Opt level: O2

QVariant *
_q_interpolateVariant<QLineF>
          (QVariant *__return_storage_ptr__,QLineF *from,QLineF *to,qreal progress)

{
  QLineF l;
  long in_FS_OFFSET;
  QLineF local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  _q_interpolate<QLineF>(&local_38,from,to,progress);
  l.pt1.yp = local_38.pt1.yp;
  l.pt1.xp = local_38.pt1.xp;
  l.pt2.xp = local_38.pt2.xp;
  l.pt2.yp = local_38.pt2.yp;
  QVariant::QVariant(__return_storage_ptr__,l);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QVariant _q_interpolateVariant(const T &from, const T &to, qreal progress)
{
    return _q_interpolate(from, to, progress);
}